

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

sz_ssize_t __thiscall sznet::net::Buffer::readFd(Buffer *this,sz_sock fd,int *savedErrno)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  sz_ssize_t sVar4;
  
  sVar3 = this->m_writerIndex;
  if ((long)this->m_wrapSize <= (long)sVar3) {
    wrapBuffer(this);
    sVar3 = this->m_writerIndex;
  }
  pcVar1 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = sockets::sz_read(fd,pcVar1 + sVar3,
                           *(int *)&(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                           ((int)pcVar1 + (int)sVar3));
  if (sVar4 < 0) {
    iVar2 = sz_getlasterr();
    *savedErrno = iVar2;
  }
  else {
    this->m_writerIndex = this->m_writerIndex + sVar4;
  }
  return sVar4;
}

Assistant:

sz_ssize_t Buffer::readFd(sockets::sz_sock fd, int* savedErrno)
{
	// �ж��Ƿ���Ҫ�ص�
	if ((begin() + m_writerIndex) >= (begin() + m_wrapSize))
	{
		wrapBuffer();
	}

	char* buf = (begin() + m_writerIndex);
	const size_t writable = writableBytes();
	const sz_ssize_t n = sockets::sz_read(fd, buf, static_cast<int>(writable));
	if (n < 0)
	{
		*savedErrno = sz_getlasterr();
	}
	else
	{
		m_writerIndex += n;
	}
	
	return n;
}